

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

ParameterDeclarationSyntax * __thiscall
psy::C::
List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
::lastValue(List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
            *this)

{
  SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *local_20;
  SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *it;
  ParameterDeclarationSyntax *v;
  List<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
  *this_local;
  
  it = (SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)0x0;
  for (local_20 = (SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)this;
      local_20 != (SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> *)0x0;
      local_20 = *(SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> **)
                  ((long)&local_20->
                          super_CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
                  + 0x10)) {
    if (*(ParameterDeclarationSyntax **)
         ((long)&local_20->
                 super_CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
         + 8) != (ParameterDeclarationSyntax *)0x0) {
      it = *(SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*> **)
            ((long)&local_20->
                    super_CoreSyntaxNodeList<psy::C::ParameterDeclarationSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ParameterDeclarationSyntax_*>_>
            + 8);
    }
  }
  return (ParameterDeclarationSyntax *)it;
}

Assistant:

ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }